

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadCrashHdl.cpp
# Opt level: O0

void __thiscall ThreadSettings::~ThreadSettings(ThreadSettings *this)

{
  long *in_RDI;
  
  if (in_RDI[1] != 0) {
    uselocale((__locale_t)in_RDI[1]);
  }
  if (*in_RDI != 0) {
    freelocale((__locale_t)*in_RDI);
    *in_RDI = 0;
  }
  CrashHandlerUnregisterThread();
  return;
}

Assistant:

ThreadSettings::~ThreadSettings()
{
#if IBM
    _configthreadlocale(_DISABLE_PER_THREAD_LOCALE);
#else
    if (prevLocale)
        uselocale(prevLocale);
    if (threadLocale) {
        freelocale(threadLocale);
        threadLocale = locale_t(0);
    }
#endif
    CrashHandlerUnregisterThread();
}